

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall
CGL::SceneObjects::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  BVHNode *pBVar1;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *in_RDI;
  size_t in_stack_00000510;
  BVHAccel *in_stack_00000518;
  iterator in_stack_00000520;
  iterator in_stack_00000528;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *this_00;
  Aggregate *in_stack_ffffffffffffff90;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  *in_stack_ffffffffffffff98;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  *in_stack_ffffffffffffffd8;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  *in_stack_ffffffffffffffe0;
  
  Aggregate::Aggregate(in_stack_ffffffffffffff90);
  (in_RDI->
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_get_bbox_00140b18;
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  vector((vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *)
         0x120173);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  vector(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
             *)&stack0xffffffffffffffd0;
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  operator=(in_RDI,in_stack_ffffffffffffff98);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  ~vector(in_RDI);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  begin(this_00);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::end
            (this_00);
  pBVar1 = construct_bvh(in_stack_00000518,in_stack_00000528,in_stack_00000520,in_stack_00000510);
  in_RDI[3].
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar1;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
                   size_t max_leaf_size) {

  primitives = std::vector<Primitive *>(_primitives);
  root = construct_bvh(primitives.begin(), primitives.end(), max_leaf_size);
}